

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall libtorrent::upnp::start(upnp *this)

{
  bool bVar1;
  double dVar2;
  string local_70;
  string local_40;
  undefined1 local_20 [8];
  error_code ec;
  upnp *this_local;
  
  ec.cat_ = (error_category *)this;
  boost::system::error_code::error_code((error_code *)local_20);
  open_multicast_socket(this,&this->m_multicast,(error_code *)local_20);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_20);
  if ((bVar1) && (bVar1 = should_log(this), bVar1)) {
    boost::system::error_code::message_abi_cxx11_(&local_40,(error_code *)local_20);
    dVar2 = (double)::std::__cxx11::string::c_str();
    log(this,dVar2);
    ::std::__cxx11::string::~string((string *)&local_40);
    this->m_disabled = true;
  }
  else {
    open_unicast_socket(this,&this->m_unicast,(error_code *)local_20);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_20);
    if ((bVar1) && (bVar1 = should_log(this), bVar1)) {
      boost::system::error_code::message_abi_cxx11_(&local_70,(error_code *)local_20);
      dVar2 = (double)::std::__cxx11::string::c_str();
      log(this,dVar2);
      ::std::__cxx11::string::~string((string *)&local_70);
      this->m_disabled = true;
    }
    else {
      libtorrent::aux::
      container_wrapper<libtorrent::upnp::global_mapping_t,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::vector<libtorrent::upnp::global_mapping_t,std::allocator<libtorrent::upnp::global_mapping_t>>>
      ::reserve<int,void>((container_wrapper<libtorrent::upnp::global_mapping_t,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::vector<libtorrent::upnp::global_mapping_t,std::allocator<libtorrent::upnp::global_mapping_t>>>
                           *)&this->m_mappings,2);
      discover_device_impl(this);
    }
  }
  return;
}

Assistant:

void upnp::start()
{
	TORRENT_ASSERT(is_single_thread());

	error_code ec;
	open_multicast_socket(m_multicast, ec);
#ifndef TORRENT_DISABLE_LOGGING
	if (ec && should_log())
	{
		log("failed to open multicast socket: \"%s\""
			, ec.message().c_str());
		m_disabled = true;
		return;
	}
#endif

	open_unicast_socket(m_unicast, ec);
#ifndef TORRENT_DISABLE_LOGGING
	if (ec && should_log())
	{
		log("failed to open unicast socket: \"%s\""
			, ec.message().c_str());
		m_disabled = true;
		return;
	}
#endif

	m_mappings.reserve(2);

	discover_device_impl();
}